

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void lzma_sha256_finish(lzma_check_state *check)

{
  char *pcVar1;
  uint64_t uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  ulong uVar29;
  long lVar30;
  uint8_t uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  uVar31 = 0x80;
  uVar29 = (ulong)((uint)(check->state).sha256.size & 0x3f);
  do {
    while ((check->buffer).u8[uVar29] = uVar31, uVar29 == 0x3f) {
      process(check);
      uVar31 = '\0';
      uVar29 = 0;
    }
    uVar31 = '\0';
    bVar32 = uVar29 != 0x37;
    uVar29 = uVar29 + 1;
  } while (bVar32);
  uVar2 = (check->state).sha256.size;
  uVar29 = uVar2 << 3;
  (check->state).sha256.size = uVar29;
  (check->buffer).u64[7] =
       uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18 |
       (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
       (uVar29 & 0xff00) << 0x28 | uVar2 << 0x3b;
  process(check);
  lVar30 = 0;
  do {
    auVar33 = *(undefined1 (*) [16])((long)&check->state + lVar30 * 4);
    auVar34[1] = 0;
    auVar34[0] = auVar33[8];
    auVar34[2] = auVar33[9];
    auVar34[3] = 0;
    auVar34[4] = auVar33[10];
    auVar34[5] = 0;
    auVar34[6] = auVar33[0xb];
    auVar34[7] = 0;
    auVar34[8] = auVar33[0xc];
    auVar34[9] = 0;
    auVar34[10] = auVar33[0xd];
    auVar34[0xb] = 0;
    auVar34[0xc] = auVar33[0xe];
    auVar34[0xd] = 0;
    auVar34[0xe] = auVar33[0xf];
    auVar34[0xf] = 0;
    auVar34 = pshuflw(auVar34,auVar34,0x1b);
    auVar34 = pshufhw(auVar34,auVar34,0x1b);
    auVar19[0xd] = 0;
    auVar19._0_13_ = auVar33._0_13_;
    auVar19[0xe] = auVar33[7];
    auVar20[0xc] = auVar33[6];
    auVar20._0_12_ = auVar33._0_12_;
    auVar20._13_2_ = auVar19._13_2_;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar33._0_11_;
    auVar21._12_3_ = auVar20._12_3_;
    auVar22[10] = auVar33[5];
    auVar22._0_10_ = auVar33._0_10_;
    auVar22._11_4_ = auVar21._11_4_;
    auVar23[9] = 0;
    auVar23._0_9_ = auVar33._0_9_;
    auVar23._10_5_ = auVar22._10_5_;
    auVar24[8] = auVar33[4];
    auVar24._0_8_ = auVar33._0_8_;
    auVar24._9_6_ = auVar23._9_6_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar24._8_7_;
    auVar27._1_8_ = SUB158(auVar26 << 0x40,7);
    auVar27[0] = auVar33[3];
    auVar27._9_6_ = 0;
    auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
    auVar28[0] = auVar33[2];
    auVar28._11_4_ = 0;
    auVar25[2] = auVar33[1];
    auVar25._0_2_ = auVar33._0_2_;
    auVar25._3_12_ = SUB1512(auVar28 << 0x20,3);
    auVar33._0_2_ = auVar33._0_2_ & 0xff;
    auVar33._2_13_ = auVar25._2_13_;
    auVar33[0xf] = 0;
    auVar33 = pshuflw(auVar33,auVar33,0x1b);
    auVar33 = pshufhw(auVar33,auVar33,0x1b);
    sVar3 = auVar33._0_2_;
    sVar4 = auVar33._2_2_;
    sVar5 = auVar33._4_2_;
    sVar6 = auVar33._6_2_;
    sVar7 = auVar33._8_2_;
    sVar8 = auVar33._10_2_;
    sVar9 = auVar33._12_2_;
    sVar10 = auVar33._14_2_;
    sVar11 = auVar34._0_2_;
    sVar12 = auVar34._2_2_;
    sVar13 = auVar34._4_2_;
    sVar14 = auVar34._6_2_;
    sVar15 = auVar34._8_2_;
    sVar16 = auVar34._10_2_;
    sVar17 = auVar34._12_2_;
    sVar18 = auVar34._14_2_;
    pcVar1 = (char *)((long)&check->buffer + lVar30 * 4);
    *pcVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar33[0] - (0xff < sVar3);
    pcVar1[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar33[2] - (0xff < sVar4);
    pcVar1[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar33[4] - (0xff < sVar5);
    pcVar1[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar33[6] - (0xff < sVar6);
    pcVar1[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar33[8] - (0xff < sVar7);
    pcVar1[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar33[10] - (0xff < sVar8);
    pcVar1[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar33[0xc] - (0xff < sVar9);
    pcVar1[7] = (0 < sVar10) * (sVar10 < 0x100) * auVar33[0xe] - (0xff < sVar10);
    pcVar1[8] = (0 < sVar11) * (sVar11 < 0x100) * auVar34[0] - (0xff < sVar11);
    pcVar1[9] = (0 < sVar12) * (sVar12 < 0x100) * auVar34[2] - (0xff < sVar12);
    pcVar1[10] = (0 < sVar13) * (sVar13 < 0x100) * auVar34[4] - (0xff < sVar13);
    pcVar1[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar34[6] - (0xff < sVar14);
    pcVar1[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar34[8] - (0xff < sVar15);
    pcVar1[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar34[10] - (0xff < sVar16);
    pcVar1[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar34[0xc] - (0xff < sVar17);
    pcVar1[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar34[0xe] - (0xff < sVar18);
    lVar30 = lVar30 + 4;
  } while (lVar30 != 8);
  return;
}

Assistant:

extern void
lzma_sha256_finish(lzma_check_state *check)
{
	size_t i;

	// Add padding as described in RFC 3174 (it describes SHA-1 but
	// the same padding style is used for SHA-256 too).
	size_t pos = check->state.sha256.size & 0x3F;
	check->buffer.u8[pos++] = 0x80;

	while (pos != 64 - 8) {
		if (pos == 64) {
			process(check);
			pos = 0;
		}

		check->buffer.u8[pos++] = 0x00;
	}

	// Convert the message size from bytes to bits.
	check->state.sha256.size *= 8;

	check->buffer.u64[(64 - 8) / 8] = conv64be(check->state.sha256.size);

	process(check);

	for (i = 0; i < 8; ++i)
		check->buffer.u32[i] = conv32be(check->state.sha256.state[i]);

	return;
}